

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktrade.cpp
# Opt level: O1

ostream * Kraken::operator<<(ostream *os,KTrade *kt)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  char local_24;
  char local_23;
  char local_22;
  char local_21;
  
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(os,&local_24,1);
  poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\",\"",3);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_23,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\",\"",3);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_22,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\",\"",3);
  lVar1 = *(long *)poVar3;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar3 + lVar2 + 0x18) = *(uint *)(poVar3 + lVar2 + 0x18) & 0xfffffefb | 4;
  *(undefined8 *)(poVar3 + *(long *)(lVar1 + -0x18) + 8) = 5;
  poVar3 = std::ostream::_M_insert<double>(kt->price);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\",\"",3);
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 8) = 9;
  poVar3 = std::ostream::_M_insert<double>(kt->volume);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_21,1);
  return poVar3;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const KTrade& kt)
{
   return os << '"' << kt.time << "\",\""
	     << static_cast<char>(kt.order) << "\",\""
	     << static_cast<char>(kt.otype) << "\",\""
	     << std::fixed
	     << std::setprecision(5) << kt.price << "\",\""
	     << std::setprecision(9) << kt.volume << '"';
}